

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3IsShadowTableOf(sqlite3 *db,Table *pTab,char *zName)

{
  int N;
  int iVar1;
  long *plVar2;
  Module *pMod;
  int nName;
  char *zName_local;
  Table *pTab_local;
  sqlite3 *db_local;
  
  if (pTab->eTabType == '\x01') {
    N = sqlite3Strlen30(pTab->zName);
    iVar1 = sqlite3_strnicmp(zName,pTab->zName,N);
    if (iVar1 == 0) {
      if (zName[N] == '_') {
        plVar2 = (long *)sqlite3HashFind(&db->aModule,*(pTab->u).vtab.azArg);
        if (plVar2 == (long *)0x0) {
          db_local._4_4_ = 0;
        }
        else if (*(int *)*plVar2 < 3) {
          db_local._4_4_ = 0;
        }
        else if (*(long *)(*plVar2 + 0xb8) == 0) {
          db_local._4_4_ = 0;
        }
        else {
          db_local._4_4_ = (**(code **)(*plVar2 + 0xb8))(zName + (long)N + 1);
        }
      }
      else {
        db_local._4_4_ = 0;
      }
    }
    else {
      db_local._4_4_ = 0;
    }
  }
  else {
    db_local._4_4_ = 0;
  }
  return db_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3IsShadowTableOf(sqlite3 *db, Table *pTab, const char *zName){
  int nName;                    /* Length of zName */
  Module *pMod;                 /* Module for the virtual table */

  if( !IsVirtual(pTab) ) return 0;
  nName = sqlite3Strlen30(pTab->zName);
  if( sqlite3_strnicmp(zName, pTab->zName, nName)!=0 ) return 0;
  if( zName[nName]!='_' ) return 0;
  pMod = (Module*)sqlite3HashFind(&db->aModule, pTab->u.vtab.azArg[0]);
  if( pMod==0 ) return 0;
  if( pMod->pModule->iVersion<3 ) return 0;
  if( pMod->pModule->xShadowName==0 ) return 0;
  return pMod->pModule->xShadowName(zName+nName+1);
}